

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
draco::CornerTable::Create
          (IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
           *faces)

{
  bool bVar1;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  *faces_00;
  tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_> in_RDI;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> ct;
  pointer in_stack_ffffffffffffffa8;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *this;
  _Head_base<0UL,_draco::CornerTable_*,_false> this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CornerTable *in_stack_ffffffffffffffe0;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> local_18 [3];
  
  this_00._M_head_impl =
       (CornerTable *)
       in_RDI.super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
       .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  faces_00 = (IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
              *)operator_new(0xa8);
  CornerTable(in_stack_ffffffffffffffe0);
  this = local_18;
  std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
  unique_ptr<std::default_delete<draco::CornerTable>,void>(this,in_stack_ffffffffffffffa8);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x187cd5);
  bVar1 = Init((CornerTable *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),faces_00
              );
  if (bVar1) {
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::unique_ptr
              (this,(unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                    in_stack_ffffffffffffffa8);
  }
  else {
    std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
    unique_ptr<std::default_delete<draco::CornerTable>,void>(this,in_stack_ffffffffffffffa8);
  }
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             this_00._M_head_impl);
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         in_RDI.
         super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
         super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CornerTable> CornerTable::Create(
    const IndexTypeVector<FaceIndex, FaceType> &faces) {
  std::unique_ptr<CornerTable> ct(new CornerTable());
  if (!ct->Init(faces)) {
    return nullptr;
  }
  return ct;
}